

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NodeDelayTraceArrival(Abc_Obj_t *pNode,Vec_Int_t *vSlacks)

{
  Abc_Ntk_t *pAVar1;
  float *pfVar2;
  long *plVar3;
  float *pfVar4;
  Mio_PinPhase_t MVar5;
  int iVar6;
  Mio_Pin_t *pMVar7;
  long lVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pAVar1 = pNode->pNtk;
  pfVar2 = (float *)pAVar1->pManTime->vArrs->pArray[pNode->Id];
  pfVar2[0] = -1e+09;
  pfVar2[1] = -1e+09;
  if ((((pAVar1->ntkFunc == ABC_FUNC_MAP) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
      ((pNode->vFanins).nSize == 1)) && ((pNode->field_5).pData == (void *)0x0)) {
    plVar3 = (long *)pAVar1->vObjs->pArray[*(pNode->vFanins).pArray];
    *(undefined8 *)pfVar2 =
         **(undefined8 **)
           (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) + (long)(int)plVar3[2] * 8);
  }
  else {
    pMVar7 = Mio_GateReadPins((Mio_Gate_t *)(pNode->field_5).pData);
    for (lVar8 = 0; lVar8 < (pNode->vFanins).nSize; lVar8 = lVar8 + 1) {
      plVar3 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
      pfVar4 = *(float **)
                (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) +
                (long)(int)plVar3[2] * 8);
      MVar5 = Mio_PinReadPhase(pMVar7);
      dVar10 = Mio_PinReadDelayBlockRise(pMVar7);
      dVar11 = Mio_PinReadDelayBlockFall(pMVar7);
      fVar9 = *pfVar2;
      if (MVar5 == MIO_PHASE_INV) {
LAB_002c91c6:
        fVar13 = (float)dVar10 + pfVar4[1];
        if (fVar9 < fVar13) {
          *pfVar2 = fVar13;
        }
        fVar9 = (float)dVar11 + *pfVar4;
        if (pfVar2[1] <= fVar9 && fVar9 != pfVar2[1]) {
          pfVar2[1] = fVar9;
        }
      }
      else {
        fVar13 = *pfVar4 + (float)dVar10;
        if (fVar9 < fVar13) {
          *pfVar2 = fVar13;
          fVar9 = fVar13;
        }
        fVar13 = pfVar4[1] + (float)dVar11;
        if (pfVar2[1] <= fVar13 && fVar13 != pfVar2[1]) {
          pfVar2[1] = fVar13;
        }
        if (MVar5 != MIO_PHASE_NONINV) goto LAB_002c91c6;
      }
      pMVar7 = Mio_PinReadNext(pMVar7);
    }
    if (vSlacks != (Vec_Int_t *)0x0) {
      pMVar7 = Mio_GateReadPins((Mio_Gate_t *)(pNode->field_5).pData);
      for (lVar8 = 0; lVar8 < (pNode->vFanins).nSize; lVar8 = lVar8 + 1) {
        plVar3 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
        pfVar4 = *(float **)
                  (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) +
                  (long)(int)plVar3[2] * 8);
        MVar5 = Mio_PinReadPhase(pMVar7);
        dVar10 = Mio_PinReadDelayBlockRise(pMVar7);
        dVar11 = Mio_PinReadDelayBlockFall(pMVar7);
        if (MVar5 == MIO_PHASE_INV) {
          fVar9 = *pfVar4;
          fVar13 = pfVar4[1];
          fVar12 = pfVar2[1];
          fVar16 = 1e+09;
LAB_002c9314:
          fVar14 = (fVar13 + (float)dVar10) - *pfVar2;
          fVar13 = -fVar14;
          if (-fVar14 <= fVar14) {
            fVar13 = fVar14;
          }
          if (fVar13 <= fVar16) {
            fVar16 = fVar13;
          }
          fVar12 = (fVar9 + (float)dVar11) - fVar12;
          fVar9 = -fVar12;
          if (-fVar12 <= fVar12) {
            fVar9 = fVar12;
          }
          if (fVar9 <= fVar16) {
            fVar16 = fVar9;
          }
        }
        else {
          fVar9 = *pfVar4;
          fVar13 = pfVar4[1];
          fVar16 = (fVar9 + (float)dVar10) - *pfVar2;
          fVar12 = -fVar16;
          if (-fVar16 <= fVar16) {
            fVar12 = fVar16;
          }
          fVar16 = 1e+09;
          if (fVar12 <= 1e+09) {
            fVar16 = fVar12;
          }
          fVar12 = pfVar2[1];
          fVar15 = (fVar13 + (float)dVar11) - fVar12;
          fVar14 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar14 = fVar15;
          }
          if (fVar14 <= fVar16) {
            fVar16 = fVar14;
          }
          if (MVar5 != MIO_PHASE_NONINV) goto LAB_002c9314;
        }
        pMVar7 = Mio_PinReadNext(pMVar7);
        iVar6 = Vec_IntEntry(vSlacks,pNode->Id);
        Vec_IntWriteEntry(vSlacks,iVar6 + (int)lVar8,(int)fVar16);
      }
    }
  }
  return;
}

Assistant:

void Abc_NodeDelayTraceArrival( Abc_Obj_t * pNode, Vec_Int_t * vSlacks )
{
    Abc_Obj_t * pFanin;
    Abc_Time_t * pTimeIn, * pTimeOut;
    float tDelayBlockRise, tDelayBlockFall;
    Mio_PinPhase_t PinPhase;
    Mio_Pin_t * pPin;
    int i;

    // start the arrival time of the node
    pTimeOut = Abc_NodeArrival(pNode);
    pTimeOut->Rise = pTimeOut->Fall = -ABC_INFINITY; 
    // consider the buffer
    if ( Abc_ObjIsBarBuf(pNode) )
    {
        pTimeIn = Abc_NodeArrival(Abc_ObjFanin0(pNode));
        *pTimeOut = *pTimeIn;
        return;
    }
    // go through the pins of the gate
    pPin = Mio_GateReadPins((Mio_Gate_t *)pNode->pData);
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        pTimeIn = Abc_NodeArrival(pFanin);
        // get the interesting parameters of this pin
        PinPhase = Mio_PinReadPhase(pPin);
        tDelayBlockRise = (float)Mio_PinReadDelayBlockRise( pPin );  
        tDelayBlockFall = (float)Mio_PinReadDelayBlockFall( pPin );  
        // compute the arrival times of the positive phase
        if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
        {
            if ( pTimeOut->Rise < pTimeIn->Rise + tDelayBlockRise )
                pTimeOut->Rise = pTimeIn->Rise + tDelayBlockRise;
            if ( pTimeOut->Fall < pTimeIn->Fall + tDelayBlockFall )
                pTimeOut->Fall = pTimeIn->Fall + tDelayBlockFall;
        }
        if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
        {
            if ( pTimeOut->Rise < pTimeIn->Fall + tDelayBlockRise )
                pTimeOut->Rise = pTimeIn->Fall + tDelayBlockRise;
            if ( pTimeOut->Fall < pTimeIn->Rise + tDelayBlockFall )
                pTimeOut->Fall = pTimeIn->Rise + tDelayBlockFall;
        }
        pPin = Mio_PinReadNext(pPin);
    }

    // compute edge slacks
    if ( vSlacks )
    {
        float Slack;
        // go through the pins of the gate
        pPin = Mio_GateReadPins((Mio_Gate_t *)pNode->pData);
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            pTimeIn = Abc_NodeArrival(pFanin);
            // get the interesting parameters of this pin
            PinPhase = Mio_PinReadPhase(pPin);
            tDelayBlockRise = (float)Mio_PinReadDelayBlockRise( pPin );  
            tDelayBlockFall = (float)Mio_PinReadDelayBlockFall( pPin );  
            // compute the arrival times of the positive phase
            Slack = ABC_INFINITY;
            if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
            {
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Rise + tDelayBlockRise - pTimeOut->Rise) );
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Fall + tDelayBlockFall - pTimeOut->Fall) );
            }
            if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
            {
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Fall + tDelayBlockRise - pTimeOut->Rise) );
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Rise + tDelayBlockFall - pTimeOut->Fall) );
            }
            pPin = Mio_PinReadNext(pPin);
            Abc_NtkDelayTraceSetSlack( vSlacks, pNode, i, Slack );
        }
    }
}